

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddLin.c
# Opt level: O0

Move * cuddZddUndoMoves(DdManager *table,Move *moves)

{
  Move *pMVar1;
  int iVar2;
  DdNode *pDVar3;
  int size;
  Move *invmove;
  Move *move;
  Move *invmoves;
  Move *moves_local;
  DdManager *table_local;
  
  move = (Move *)0x0;
  invmove = moves;
  while( true ) {
    if (invmove == (Move *)0x0) {
      return move;
    }
    pDVar3 = cuddDynamicAllocNode(table);
    if (pDVar3 == (DdNode *)0x0) break;
    pDVar3->index = invmove->x;
    pDVar3->ref = invmove->y;
    (pDVar3->type).kids.T = (DdNode *)move;
    move = (Move *)pDVar3;
    if (invmove->flags == 0) {
      *(undefined4 *)&pDVar3->next = 0;
      iVar2 = cuddZddSwapInPlace(table,invmove->x,invmove->y);
    }
    else if (invmove->flags == 1) {
      *(undefined4 *)&pDVar3->next = 2;
      iVar2 = cuddZddLinearInPlace(table,invmove->x,invmove->y);
      if (iVar2 == 0) break;
      iVar2 = cuddZddSwapInPlace(table,invmove->x,invmove->y);
    }
    else {
      *(undefined4 *)&pDVar3->next = 1;
      iVar2 = cuddZddSwapInPlace(table,invmove->x,invmove->y);
      if (iVar2 == 0) break;
      iVar2 = cuddZddLinearInPlace(table,invmove->x,invmove->y);
    }
    if (iVar2 == 0) break;
    *(int *)((long)&pDVar3->next + 4) = iVar2;
    invmove = invmove->next;
  }
  while (move != (Move *)0x0) {
    pMVar1 = move->next;
    move->y = 0;
    *(DdNode **)&move->flags = table->nextFree;
    table->nextFree = (DdNode *)move;
    move = pMVar1;
  }
  return (Move *)0xffffffffffffffff;
}

Assistant:

static Move*
cuddZddUndoMoves(
  DdManager * table,
  Move * moves)
{
    Move *invmoves = NULL;
    Move *move;
    Move *invmove;
    int size;

    for (move = moves; move != NULL; move = move->next) {
        invmove = (Move *) cuddDynamicAllocNode(table);
        if (invmove == NULL) goto cuddZddUndoMovesOutOfMem;
        invmove->x = move->x;
        invmove->y = move->y;
        invmove->next = invmoves;
        invmoves = invmove;
        if (move->flags == CUDD_SWAP_MOVE) {
            invmove->flags = CUDD_SWAP_MOVE;
            size = cuddZddSwapInPlace(table,(int)move->x,(int)move->y);
            if (!size) goto cuddZddUndoMovesOutOfMem;
        } else if (move->flags == CUDD_LINEAR_TRANSFORM_MOVE) {
            invmove->flags = CUDD_INVERSE_TRANSFORM_MOVE;
            size = cuddZddLinearInPlace(table,(int)move->x,(int)move->y);
            if (!size) goto cuddZddUndoMovesOutOfMem;
            size = cuddZddSwapInPlace(table,(int)move->x,(int)move->y);
            if (!size) goto cuddZddUndoMovesOutOfMem;
        } else { /* must be CUDD_INVERSE_TRANSFORM_MOVE */
#ifdef DD_DEBUG
            (void) fprintf(table->err,"Unforseen event in ddUndoMoves!\n");
#endif
            invmove->flags = CUDD_LINEAR_TRANSFORM_MOVE;
            size = cuddZddSwapInPlace(table,(int)move->x,(int)move->y);
            if (!size) goto cuddZddUndoMovesOutOfMem;
            size = cuddZddLinearInPlace(table,(int)move->x,(int)move->y);
            if (!size) goto cuddZddUndoMovesOutOfMem;
        }
        invmove->size = size;
    }

    return(invmoves);

cuddZddUndoMovesOutOfMem:
    while (invmoves != NULL) {
        move = invmoves->next;
        cuddDeallocMove(table, invmoves);
        invmoves = move;
    }
    return((Move *) CUDD_OUT_OF_MEM);

}